

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::HandleJoystickAxisMotionEvent(CInput *this,SDL_Event *Event)

{
  SDL_JoystickID SVar1;
  int iVar2;
  int iVar3;
  CJoystick *this_00;
  long in_RSI;
  long *in_RDI;
  float fVar4;
  float DeadZone;
  int RightKey;
  int LeftKey;
  CJoystick *pJoystick;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd8;
  
  this_00 = (CJoystick *)(**(code **)(*in_RDI + 0x38))();
  if (((this_00 != (CJoystick *)0x0) &&
      (SVar1 = CJoystick::GetInstanceID(this_00), SVar1 == *(int *)(in_RSI + 8))) &&
     (*(byte *)(in_RSI + 0xc) < 0xc)) {
    iVar3 = (uint)*(byte *)(in_RSI + 0xc) * 2;
    iVar2 = iVar3 + 0x1c2;
    iVar3 = iVar3 + 0x1c3;
    fVar4 = GetJoystickDeadzone((CInput *)0x133b04);
    iVar5 = (int)((ulong)in_RDI >> 0x20);
    if ((fVar4 * -32768.0 < (float)(int)*(short *)(in_RSI + 0x10)) ||
       ((*(byte *)((long)in_RDI + (long)iVar2 + 0x1aa0) & 1) != 0)) {
      if ((fVar4 * -32768.0 < (float)(int)*(short *)(in_RSI + 0x10)) &&
         ((*(byte *)((long)in_RDI + (long)iVar2 + 0x1aa0) & 1) != 0)) {
        *(undefined1 *)((long)in_RDI + (long)iVar2 + 0x1aa0) = 0;
        AddEvent((CInput *)CONCAT44(iVar2,iVar3),(char *)CONCAT44(fVar4,in_stack_ffffffffffffffd8),
                 iVar5,(int)in_RDI);
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + (long)iVar2 + 0x1aa0) = 1;
      *(short *)((long)in_RDI + (long)iVar2 * 2 + 0x16a0) = (short)(int)in_RDI[0x394];
      AddEvent((CInput *)CONCAT44(iVar2,iVar3),(char *)CONCAT44(fVar4,in_stack_ffffffffffffffd8),
               iVar5,(int)in_RDI);
    }
    iVar5 = (int)((ulong)in_RDI >> 0x20);
    if (((float)(int)*(short *)(in_RSI + 0x10) < fVar4 * 32767.0) ||
       ((*(byte *)((long)in_RDI + (long)iVar3 + 0x1aa0) & 1) != 0)) {
      if (((float)(int)*(short *)(in_RSI + 0x10) < fVar4 * 32767.0) &&
         ((*(byte *)((long)in_RDI + (long)iVar3 + 0x1aa0) & 1) != 0)) {
        *(undefined1 *)((long)in_RDI + (long)iVar3 + 0x1aa0) = 0;
        AddEvent((CInput *)CONCAT44(iVar2,iVar3),(char *)CONCAT44(fVar4,in_stack_ffffffffffffffd8),
                 iVar5,(int)in_RDI);
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + (long)iVar3 + 0x1aa0) = 1;
      *(short *)((long)in_RDI + (long)iVar3 * 2 + 0x16a0) = (short)(int)in_RDI[0x394];
      AddEvent((CInput *)CONCAT44(iVar2,iVar3),(char *)CONCAT44(fVar4,in_stack_ffffffffffffffd8),
               iVar5,(int)in_RDI);
    }
  }
  return;
}

Assistant:

void CInput::HandleJoystickAxisMotionEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jaxis.which)
		return;
	if(Event.jaxis.axis >= NUM_JOYSTICK_AXES)
		return;

	const int LeftKey = KEY_JOY_AXIS_0_LEFT + 2 * Event.jaxis.axis;
	const int RightKey = LeftKey + 1;
	const float DeadZone = GetJoystickDeadzone();

	if(Event.jaxis.value <= SDL_JOYSTICK_AXIS_MIN * DeadZone && !m_aInputState[LeftKey])
	{
		m_aInputState[LeftKey] = true;
		m_aInputCount[LeftKey] = m_InputCounter;
		AddEvent(0, LeftKey, IInput::FLAG_PRESS);
	}
	else if(Event.jaxis.value > SDL_JOYSTICK_AXIS_MIN * DeadZone && m_aInputState[LeftKey])
	{
		m_aInputState[LeftKey] = false;
		AddEvent(0, LeftKey, IInput::FLAG_RELEASE);
	}

	if(Event.jaxis.value >= SDL_JOYSTICK_AXIS_MAX * DeadZone && !m_aInputState[RightKey])
	{
		m_aInputState[RightKey] = true;
		m_aInputCount[RightKey] = m_InputCounter;
		AddEvent(0, RightKey, IInput::FLAG_PRESS);
	}
	else if(Event.jaxis.value < SDL_JOYSTICK_AXIS_MAX * DeadZone && m_aInputState[RightKey])
	{
		m_aInputState[RightKey] = false;
		AddEvent(0, RightKey, IInput::FLAG_RELEASE);
	}
}